

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::TestFactoryImpl<IntrusiveListIteratorTest_begin_end_forward_Test>::CreateTest
          (TestFactoryImpl<IntrusiveListIteratorTest_begin_end_forward_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x30);
  IntrusiveListIteratorTest_begin_end_forward_Test::IntrusiveListIteratorTest_begin_end_forward_Test
            ((IntrusiveListIteratorTest_begin_end_forward_Test *)this_00);
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }